

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

reference __thiscall
QVLABase<QPropertyBindingPrivatePtr>::emplace_back_impl<QPropertyBindingPrivatePtr>
          (QVLABase<QPropertyBindingPrivatePtr> *this,qsizetype prealloc,void *array,
          QPropertyBindingPrivatePtr *args)

{
  reference pvVar1;
  RefCounted *pRVar2;
  long asize;
  long aalloc;
  
  asize = (this->super_QVLABaseBase).s;
  if (asize == (this->super_QVLABaseBase).a) {
    aalloc = asize + 1;
    if (asize + 1 < asize * 2) {
      aalloc = asize * 2;
    }
    reallocate_impl(this,prealloc,array,asize,aalloc);
    asize = (this->super_QVLABaseBase).s;
  }
  pvVar1 = (reference)((long)(this->super_QVLABaseBase).ptr + asize * 8);
  pRVar2 = args->d;
  args->d = (RefCounted *)0x0;
  pvVar1->d = pRVar2;
  (this->super_QVLABaseBase).s = asize + 1;
  return pvVar1;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }